

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configparser.h
# Opt level: O0

void __thiscall
phyr::RenderConfig::addConfigParam<std::__cxx11::string>
          (RenderConfig *this,string *key,
          Param<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *param)

{
  int iVar1;
  mapped_type *this_00;
  size_type sVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>_>_>
  *in_RDI;
  Param<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000008;
  ConfigArgsList *in_stack_00000010;
  bool shouldAdd;
  int idx;
  key_type *in_stack_ffffffffffffffc8;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>_>_>
  ::operator[](in_RDI,in_stack_ffffffffffffffc8);
  iVar1 = ConfigArgsList::getNextExpectedIndex((ConfigArgsList *)0x18d0cf);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
            ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>_>
                  *)in_RDI,in_stack_ffffffffffffffc8);
  sVar2 = std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>::size(this_00);
  if ((ulong)(long)iVar1 < sVar2) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>_>_>
    ::operator[](in_RDI,in_stack_ffffffffffffffc8);
    ConfigArgsList::addParam<std::__cxx11::string>(in_stack_00000010,in_stack_00000008);
  }
  return;
}

Assistant:

void addConfigParam(const std::string& key, const Param<U>& param) {
        int idx = configMap[key].getNextExpectedIndex();
        bool shouldAdd = idx < SupportedConfigMap.at(key).size();

        if (shouldAdd) configMap[key].addParam(param);
    }